

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topology.cpp
# Opt level: O0

GrobIndex __thiscall lume::TotalToGrobIndexMap::operator()(TotalToGrobIndexMap *this,index_t ind)

{
  grob_t _grobType;
  uint uVar1;
  uint uVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  LumeError *this_00;
  string *what;
  __cxx11 local_88 [55];
  allocator local_51;
  string local_50 [32];
  ulong local_30;
  size_t i;
  size_t numGrobTypes;
  TotalToGrobIndexMap *pTStack_18;
  index_t ind_local;
  TotalToGrobIndexMap *this_local;
  
  numGrobTypes._4_4_ = ind;
  pTStack_18 = this;
  i = std::vector<lume::grob_t,_std::allocator<lume::grob_t>_>::size(&this->m_grobTypes);
  local_30 = 0;
  do {
    uVar1 = numGrobTypes._4_4_;
    if (i <= local_30) {
      this_00 = (LumeError *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,"TotalToGrobIndexMap: Couldn\'t map index ",&local_51);
      std::__cxx11::to_string(local_88,numGrobTypes._4_4_);
      what = (string *)std::__cxx11::string::append(local_50);
      LumeError::LumeError(this_00,what);
      __cxa_throw(this_00,&LumeError::typeinfo,LumeError::~LumeError);
    }
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_baseInds,local_30);
    uVar2 = numGrobTypes._4_4_;
    if (*pvVar3 <= uVar1) {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_baseInds,local_30 + 1);
      if (uVar2 < *pvVar3) {
        pvVar4 = std::vector<lume::grob_t,_std::allocator<lume::grob_t>_>::operator[]
                           (&this->m_grobTypes,local_30);
        uVar1 = numGrobTypes._4_4_;
        _grobType = *pvVar4;
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->m_baseInds,local_30);
        GrobIndex::GrobIndex((GrobIndex *)&this_local,_grobType,uVar1 - *pvVar3);
        return (GrobIndex)this_local;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

GrobIndex TotalToGrobIndexMap::
operator () (const index_t ind) const
{
	const size_t numGrobTypes = m_grobTypes.size();
    for(size_t i = 0; i < numGrobTypes; ++i) {
      	if (ind >= m_baseInds [i] && ind < m_baseInds [i+1])
        	return GrobIndex(m_grobTypes[i], ind - m_baseInds[i]);
    }

    throw LumeError (string("TotalToGrobIndexMap: Couldn't map index ").
    					append (to_string(ind)));
    return GrobIndex (NO_GROB, 0);
}